

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_rwkv_wkv7(ggml_context *ctx,ggml_tensor *r,ggml_tensor *w,ggml_tensor *k,ggml_tensor *v,
              ggml_tensor *a,ggml_tensor *b,ggml_tensor *state)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  ggml_tensor *pgVar4;
  char *pcVar5;
  int line;
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  _Var3 = ggml_is_contiguous_n(r,0);
  if (_Var3) {
    _Var3 = ggml_is_contiguous_n(w,0);
    if (_Var3) {
      _Var3 = ggml_is_contiguous_n(k,0);
      if (_Var3) {
        _Var3 = ggml_is_contiguous_n(v,0);
        if (_Var3) {
          _Var3 = ggml_is_contiguous_n(a,0);
          if (_Var3) {
            _Var3 = ggml_is_contiguous_n(b,0);
            if (_Var3) {
              _Var3 = ggml_is_contiguous_n(state,0);
              if (_Var3) {
                lVar1 = k->ne[0];
                if (((w->ne[0] == lVar1) && (local_58 = k->ne[1], w->ne[1] == local_58)) &&
                   (local_50 = k->ne[2], w->ne[2] == local_50)) {
                  if (((v->ne[0] == lVar1) && (v->ne[1] == local_58)) && (v->ne[2] == local_50)) {
                    if (((a->ne[0] == lVar1) && (a->ne[1] == local_58)) && (a->ne[2] == local_50)) {
                      if (((b->ne[0] == lVar1) && (b->ne[1] == local_58)) && (b->ne[2] == local_50))
                      {
                        lVar2 = state->ne[1];
                        local_58 = local_58 * lVar1;
                        if (state->ne[0] * lVar2 * state->ne[2] * state->ne[3] -
                            local_58 * lVar1 * lVar2 == 0) {
                          local_50 = lVar2 * lVar1 + local_50;
                          local_48 = 1;
                          local_40 = 1;
                          pgVar4 = ggml_new_tensor_impl
                                             (ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
                          pgVar4->op = GGML_OP_RWKV_WKV7;
                          pgVar4->src[0] = r;
                          pgVar4->src[1] = w;
                          pgVar4->src[2] = k;
                          pgVar4->src[3] = v;
                          pgVar4->src[4] = a;
                          pgVar4->src[5] = b;
                          pgVar4->src[6] = state;
                          return pgVar4;
                        }
                        pcVar5 = "ggml_nelements(state) == S * S * H * n_seqs";
                        line = 0x12e5;
                      }
                      else {
                        pcVar5 = "b->ne[0] == S && b->ne[1] == H && b->ne[2] == n_tokens";
                        line = 0x12e4;
                      }
                    }
                    else {
                      pcVar5 = "a->ne[0] == S && a->ne[1] == H && a->ne[2] == n_tokens";
                      line = 0x12e3;
                    }
                  }
                  else {
                    pcVar5 = "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens";
                    line = 0x12e2;
                  }
                }
                else {
                  pcVar5 = "w->ne[0] == S && w->ne[1] == H && w->ne[2] == n_tokens";
                  line = 0x12e0;
                }
              }
              else {
                pcVar5 = "ggml_is_contiguous(state)";
                line = 0x12d9;
              }
            }
            else {
              pcVar5 = "ggml_is_contiguous(b)";
              line = 0x12d8;
            }
          }
          else {
            pcVar5 = "ggml_is_contiguous(a)";
            line = 0x12d7;
          }
        }
        else {
          pcVar5 = "ggml_is_contiguous(v)";
          line = 0x12d6;
        }
      }
      else {
        pcVar5 = "ggml_is_contiguous(k)";
        line = 0x12d5;
      }
    }
    else {
      pcVar5 = "ggml_is_contiguous(w)";
      line = 0x12d4;
    }
  }
  else {
    pcVar5 = "ggml_is_contiguous(r)";
    line = 0x12d3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

struct ggml_tensor * ggml_rwkv_wkv7(
        struct ggml_context * ctx,
        struct ggml_tensor  * r,
        struct ggml_tensor  * w,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * state) {
    GGML_ASSERT(ggml_is_contiguous(r));
    GGML_ASSERT(ggml_is_contiguous(w));
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(w->ne[0] == S && w->ne[1] == H && w->ne[2] == n_tokens);
        GGML_ASSERT(k->ne[0] == S && k->ne[1] == H && k->ne[2] == n_tokens);
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(a->ne[0] == S && a->ne[1] == H && a->ne[2] == n_tokens);
        GGML_ASSERT(b->ne[0] == S && b->ne[1] == H && b->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_RWKV_WKV7;
    result->src[0] = r;
    result->src[1] = w;
    result->src[2] = k;
    result->src[3] = v;
    result->src[4] = a;
    result->src[5] = b;
    result->src[6] = state;

    return result;
}